

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O2

void __thiscall FusionEKF::ProcessMeasurement(FusionEKF *this,MeasurementPackage *measurement_pack)

{
  KalmanFilter *this_00;
  VectorXd *pVVar1;
  MatrixXd *pMVar2;
  double *__ptr;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar3;
  double dVar4;
  DenseIndex DVar5;
  DenseIndex DVar6;
  MeasurementPackage *pMVar7;
  double *__tmp;
  Scalar *pSVar8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar9;
  double *pdVar10;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar11;
  CoeffReturnType pdVar12;
  ostream *poVar13;
  float fVar14;
  float fVar15;
  Tools tools;
  Scalar local_e8;
  double local_e0;
  MeasurementPackage *local_d8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_d0;
  VectorXd *local_b0;
  double local_a8;
  Scalar local_a0;
  double local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  
  if (this->is_initialized_ != false) {
    fVar14 = (float)((double)(measurement_pack->timestamp_ - this->previous_timestamp_) / 1000000.0)
    ;
    this->previous_timestamp_ = measurement_pack->timestamp_;
    local_a8 = (double)CONCAT44(local_a8._4_4_,fVar14 * fVar14);
    fVar15 = fVar14 * fVar14 * fVar14;
    local_e0 = (double)fVar14;
    pMVar2 = &(this->ekf_).F_;
    local_b0._0_4_ = fVar15 * fVar14;
    local_d8._0_4_ = fVar15;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)pMVar2,0,2);
    *pSVar8 = local_e0;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)pMVar2,1,3);
    *pSVar8 = local_e0;
    local_d0.m_xpr = &(this->ekf_).Q_;
    local_b0._0_4_ = local_b0._0_4_ * 0.25;
    local_d0.m_row = 0;
    local_d0.m_col = 1;
    local_d0.m_currentBlockRows = 1;
    *(this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = (double)(this->noise_ax * local_b0._0_4_);
    tools._vptr_Tools = (_func_int **)0x0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_d0,(Scalar *)&tools);
    local_d8._0_4_ = local_d8._0_4_ * 0.5;
    local_e8 = (Scalar)(this->noise_ax * local_d8._0_4_);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_e8);
    local_a0 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_a0);
    local_38 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_38);
    local_40 = (Scalar)(local_b0._0_4_ * this->noise_ay);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_40);
    local_48 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_48);
    local_50 = (Scalar)(this->noise_ay * local_d8._0_4_);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_50);
    local_58 = (Scalar)(this->noise_ax * local_d8._0_4_);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_58);
    local_60 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_60);
    local_68 = (Scalar)(this->noise_ax * local_a8._0_4_);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_68);
    local_70 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_70);
    local_78 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_78);
    local_80 = (Scalar)(local_d8._0_4_ * this->noise_ay);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_80);
    local_88 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_88);
    local_90 = (Scalar)(local_a8._0_4_ * this->noise_ay);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar9,&local_90);
    this_00 = &this->ekf_;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_d0)
    ;
    KalmanFilter::Predict(this_00);
    if (measurement_pack->sensor_type_ == RADAR) {
      Tools::Tools(&tools);
      Tools::CalculateJacobian((MatrixXd *)&local_d0,&tools,&(this->ekf_).x_);
      pMVar2 = (MatrixXd *)
               (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (double *)local_d0.m_xpr;
      DVar5 = (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
      DVar6 = (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols;
      (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = local_d0.m_row;
      (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = local_d0.m_col;
      local_d0.m_xpr = pMVar2;
      local_d0.m_row = DVar5;
      local_d0.m_col = DVar6;
      free(pMVar2);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_radar_);
      KalmanFilter::UpdateEKF(this_00,&measurement_pack->raw_measurements_);
      Tools::~Tools(&tools);
    }
    else {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).H_,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->H_laser_);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_laser_);
      KalmanFilter::Update(this_00,&measurement_pack->raw_measurements_);
    }
    poVar13 = std::operator<<((ostream *)&std::cout,"x_ = ");
    poVar13 = Eigen::operator<<(poVar13,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                        &(this->ekf_).x_);
    std::endl<char,std::char_traits<char>>(poVar13);
    poVar13 = std::operator<<((ostream *)&std::cout,"P_ = ");
    poVar13 = Eigen::operator<<(poVar13,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                        &(this->ekf_).P_);
    std::endl<char,std::char_traits<char>>(poVar13);
    return;
  }
  poVar13 = std::operator<<((ostream *)&std::cout,"EKF: ");
  std::endl<char,std::char_traits<char>>(poVar13);
  pdVar10 = (double *)Eigen::internal::aligned_malloc(0x20);
  pVVar1 = &(this->ekf_).x_;
  __ptr = (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_data;
  (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       pdVar10;
  (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       4;
  free(__ptr);
  local_d0.m_row = 0;
  local_d0.m_col = 1;
  local_d0.m_currentBlockRows = 1;
  *(this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       1.0;
  tools._vptr_Tools = (_func_int **)&DAT_3ff0000000000000;
  local_d0.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_d0,
                       (Scalar *)&tools);
  local_e8 = 1.0;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                      (pCVar11,&local_e8);
  local_a0 = 1.0;
  local_d8 = measurement_pack;
  local_b0 = pVVar1;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar11,&local_a0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_d0);
  tools._vptr_Tools._0_4_ = 4;
  local_e8._0_4_ = 4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_d0,(int *)&tools,(int *)&local_e8);
  pMVar3 = (Matrix<double,__1,__1,_0,__1,__1> *)
           (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)local_d0.m_xpr;
  DVar5 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows;
  DVar6 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols;
  (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = local_d0.m_row;
  (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = local_d0.m_col;
  local_d0.m_xpr = pMVar3;
  local_d0.m_row = DVar5;
  local_d0.m_col = DVar6;
  free(pMVar3);
  tools._vptr_Tools._0_4_ = 4;
  local_e8._0_4_ = 4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_d0,(int *)&tools,(int *)&local_e8);
  pMVar3 = (Matrix<double,__1,__1,_0,__1,__1> *)
           (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)local_d0.m_xpr;
  DVar5 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows;
  DVar6 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols;
  (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = local_d0.m_row;
  (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = local_d0.m_col;
  local_d0.m_xpr = pMVar3;
  local_d0.m_row = DVar5;
  local_d0.m_col = DVar6;
  free(pMVar3);
  tools._vptr_Tools._0_4_ = 4;
  local_e8 = (Scalar)CONCAT44(local_e8._4_4_,4);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_d0,(int *)&tools,(int *)&local_e8);
  pMVar3 = (Matrix<double,__1,__1,_0,__1,__1> *)
           (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)local_d0.m_xpr;
  DVar5 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows;
  DVar6 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols;
  (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = local_d0.m_row;
  (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = local_d0.m_col;
  local_d0.m_xpr = pMVar3;
  local_d0.m_row = DVar5;
  local_d0.m_col = DVar6;
  free(pMVar3);
  local_d0.m_row = 0;
  local_d0.m_col = 1;
  local_d0.m_currentBlockRows = 1;
  *(this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = 1.0;
  tools._vptr_Tools = (_func_int **)0x0;
  local_d0.m_xpr = &(this->ekf_).F_;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_d0,(Scalar *)&tools);
  local_e8 = 1.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_e8);
  local_a0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_a0);
  local_38 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_38);
  local_40 = 1.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_40);
  local_48 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_48);
  local_50 = 1.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_50);
  local_58 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_58);
  local_60 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_60);
  local_68 = 1.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_68);
  local_70 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_70);
  local_78 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_78);
  local_80 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_80);
  local_88 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_88);
  local_90 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar9,&local_90);
  pMVar2 = &(this->ekf_).P_;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_d0);
  local_d0.m_row = 0;
  local_d0.m_col = 1;
  local_d0.m_currentBlockRows = 1;
  *(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data = 1.0
  ;
  tools._vptr_Tools = (_func_int **)0x0;
  local_d0.m_xpr = pMVar2;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_d0,(Scalar *)&tools);
  local_e8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_e8);
  local_a0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_a0);
  local_38 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_38);
  local_40 = 1.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_40);
  local_48 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_48);
  local_50 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_50);
  local_58 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_58);
  local_60 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_60);
  local_68 = 1000.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_68);
  local_70 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_70);
  local_78 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_78);
  local_80 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_80);
  local_88 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_88);
  local_90 = 1000.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar9,&local_90);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_d0);
  pMVar7 = local_d8;
  if (local_d8->sensor_type_ == LASER) {
    pVVar1 = &local_d8->raw_measurements_;
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar1,0);
    local_d0.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)local_b0;
    local_d0.m_row = 0;
    local_d0.m_col = 1;
    local_d0.m_currentBlockRows = 1;
    *(local_b0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         *pdVar12;
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar1,1);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_d0,
                         pdVar12);
    tools._vptr_Tools = (_func_int **)0x0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (pCVar11,(Scalar *)&tools);
    local_e8 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar11,&local_e8);
  }
  else {
    if (local_d8->sensor_type_ != RADAR) goto LAB_0010343b;
    pVVar1 = &local_d8->raw_measurements_;
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar1,0);
    local_a8 = *pdVar12;
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar1,1);
    local_e0 = *pdVar12;
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar1,2);
    local_98 = *pdVar12;
    dVar4 = cos(local_e0);
    local_d0.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)local_b0;
    local_d0.m_row = 0;
    local_d0.m_col = 1;
    local_d0.m_currentBlockRows = 1;
    *(local_b0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         dVar4 * local_a8;
    dVar4 = sin(local_e0);
    tools._vptr_Tools = (_func_int **)(dVar4 * local_a8);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_d0,
                         (Scalar *)&tools);
    local_e8 = cos(local_e0);
    local_e8 = local_e8 * local_98;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (pCVar11,&local_e8);
    local_a0 = sin(local_e0);
    local_a0 = local_98 * local_a0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar11,&local_a0);
  }
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_d0);
LAB_0010343b:
  this->previous_timestamp_ = pMVar7->timestamp_;
  this->is_initialized_ = true;
  return;
}

Assistant:

void FusionEKF::ProcessMeasurement(const MeasurementPackage &measurement_pack) {

  /*****************************************************************************
   *  Initialization
   ****************************************************************************/

  if (!is_initialized_) {

    // Initialize the state ekf_.x_
    cout << "EKF: " << endl;
    ekf_.x_ = VectorXd(4);
    ekf_.x_ << 1, 1, 1, 1;

    // prediction covariance matrix
    ekf_.P_ = MatrixXd(4, 4);
    ekf_.F_ = MatrixXd(4, 4);
    ekf_.Q_ = MatrixXd(4, 4);

    // initialize transition matrix
    ekf_.F_ << 1, 0, 1, 0,
              0, 1, 0, 1,
              0, 0, 1, 0,
              0, 0, 0, 1;

    // initialize prediction covariance matrix
    ekf_.P_ << 1, 0, 0, 0,
              0, 1, 0, 0,
              0, 0, 1000, 0,
              0, 0, 0, 1000;
    
    if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
      
      // convert radar measurements from polar to cartesian
      // Set state ekf_.x_ to the first measurement.
      double ro = measurement_pack.raw_measurements_[0];
      double phi = measurement_pack.raw_measurements_[1];
      double ro_dot = measurement_pack.raw_measurements_[2];

      ekf_.x_ << ro * cos(phi), ro * sin(phi), ro_dot * cos(phi), ro_dot * sin(phi);
    }
    else if (measurement_pack.sensor_type_ == MeasurementPackage::LASER) {
      // Set state ekf_.x_ to the first measurement.
      ekf_.x_ << measurement_pack.raw_measurements_(0), measurement_pack.raw_measurements_(1), 0.0, 0.0;
    }

    previous_timestamp_ = measurement_pack.timestamp_;

    // done initializing
    is_initialized_ = true;
    return;
  }

  /*****************************************************************************
   *  Prediction
   ****************************************************************************/

  //compute the time elapsed between the current and previous measurements
  float dt = (measurement_pack.timestamp_ - previous_timestamp_) / 1000000.0;	//dt - expressed in seconds
  previous_timestamp_ = measurement_pack.timestamp_;

  float dt_2 = dt * dt;
  float dt_3 = dt_2 * dt;
  float dt_4 = dt_3 * dt;

  // update F matrix
  ekf_.F_(0, 2) = dt;
  ekf_.F_(1, 3) = dt;

  // Update the process covariance matrix Q
  // noise_ax = 9 and noise_ay = 9
  ekf_.Q_ << dt_4 / 4 * noise_ax, 0, dt_3 / 2 * noise_ax, 0,
    0, dt_4 / 4 * noise_ay, 0, dt_3 / 2 * noise_ay,
    dt_3 / 2 * noise_ax, 0, dt_2*noise_ax, 0,
    0, dt_3 / 2 * noise_ay, 0, dt_2*noise_ay;
  
  // predict
  
  //if (fabs(dt) > 0.001) {
  //  ekf_.Predict();
  //}
  ekf_.Predict();
  

  /*****************************************************************************
   *  Update: the state and covariance matrices.
   ****************************************************************************/

  if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
    
    // Radar updates
    Tools tools;
    ekf_.H_ = tools.CalculateJacobian(ekf_.x_);
    ekf_.R_ = R_radar_;
    ekf_.UpdateEKF(measurement_pack.raw_measurements_);
    
  } else {

    // Laser updates
    ekf_.H_ = H_laser_;
    ekf_.R_ = R_laser_;
    ekf_.Update(measurement_pack.raw_measurements_);
  }

  // print the output
  cout << "x_ = " << ekf_.x_ << endl;
  cout << "P_ = " << ekf_.P_ << endl;
}